

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
::
emplace_decomposable<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&&>,std::tuple<int&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
          *this,EnumClass *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_phmap::priv::hash_internal::EnumClass_&&> *args_1,tuple<int_&&> *args_2)

{
  size_t i;
  ctrl_t h;
  bool local_61;
  iterator local_60;
  bool local_49;
  iterator local_48;
  size_t local_38;
  size_t offset;
  tuple<const_phmap::priv::hash_internal::EnumClass_&&> *args_local_1;
  piecewise_construct_t *args_local;
  size_t hashval_local;
  EnumClass *key_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *this_local;
  
  offset = (size_t)args_1;
  args_local_1 = (tuple<const_phmap::priv::hash_internal::EnumClass_&&> *)args;
  args_local = (piecewise_construct_t *)hashval;
  hashval_local = (size_t)key;
  key_local = (EnumClass *)this;
  local_38 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
             ::_find_key<phmap::priv::hash_internal::EnumClass>
                       ((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                         *)this,key,hashval);
  if (local_38 == 0xffffffffffffffff) {
    local_38 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               ::prepare_insert((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                                 *)this,(size_t)args_local);
    emplace_at<std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&&>,std::tuple<int&&>>
              (this,local_38,(piecewise_construct_t *)args_local_1,
               (tuple<const_phmap::priv::hash_internal::EnumClass_&&> *)offset,args_2);
    i = local_38;
    h = H2((size_t)args_local);
    raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                *)this,i,h);
    local_48 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               ::iterator_at((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                              *)this,local_38);
    local_49 = true;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_48,&local_49);
  }
  else {
    local_60 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               ::iterator_at((raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                              *)this,local_38);
    local_61 = false;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_60,&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }